

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> __thiscall
SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
          (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,int param_1)

{
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> tmp;
  
  tmp = (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)this->m_int;
  if (tmp.m_int != 0x7fffffffffffffff) {
    this->m_int = tmp.m_int + 1;
    return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)tmp.m_int;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator ++( int )  SAFEINT_CPP_THROW // dummy arg to comply with spec
    {
        if( m_int != std::numeric_limits<T>::max() )
        {
            SafeInt< T, E > tmp( m_int );

            m_int++;
            return tmp;
        }
        E::SafeIntOnOverflow();
    }